

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# learn.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  double *pdVar1;
  int *piVar2;
  char *__s1;
  char *data_file;
  pointer pdVar3;
  int iVar4;
  int iVar5;
  clock_t cVar6;
  FILE *pFVar7;
  ulong uVar8;
  clock_t cVar9;
  uint uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  long lVar14;
  int iVar15;
  ulong uVar16;
  uint uVar17;
  int true_y;
  ulong unaff_R13;
  bool bVar18;
  long lVar19;
  double dVar20;
  
  __s1 = argv[1];
  ts_len = atoi(argv[2]);
  data_file = argv[3];
  data_n = atoi(argv[4]);
  alpha = atof(argv[5]);
  readfile(data_file);
  cVar6 = clock();
  iVar5 = strcmp(__s1,"train");
  if (iVar5 == 0) {
    regularization = atof(argv[6]);
    max_iter = atoi(argv[7]);
    learn_rate = atof(argv[8]);
    if (argc == 0xb) {
      test_n = atoi(argv[10]);
      readtestfile(argv[9]);
    }
    init((EVP_PKEY_CTX *)0x0);
    if (0 < max_iter) {
      bVar18 = true;
      uVar8 = 0;
      do {
        iVar5 = (int)uVar8 + (int)(uVar8 / 100) * -100;
        if (iVar5 == 0) {
          printf("epoch %d\n",uVar8);
        }
        if (0 < data_n) {
          lVar19 = 0;
          do {
            if (bVar18) {
              puts("data format:");
              puts("data:");
              if (0 < ts_len) {
                lVar14 = 0;
                do {
                  printf("%9.6f",data_x.
                                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start[lVar19].
                                 super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                 super__Vector_impl_data._M_start[lVar14]);
                  lVar14 = lVar14 + 1;
                } while (lVar14 < ts_len);
              }
              putchar(10);
              puts("label:");
              if (0 < num_c) {
                lVar14 = 0;
                do {
                  printf("%9.0f",data_y.
                                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start[lVar19].
                                 super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                 super__Vector_impl_data._M_start[lVar14]);
                  lVar14 = lVar14 + 1;
                } while (lVar14 < num_c);
              }
              putchar(10);
              bVar18 = false;
            }
            train(data_x.
                  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + lVar19,
                  data_y.
                  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + lVar19,regularization);
            lVar19 = lVar19 + 1;
          } while (lVar19 < data_n);
        }
        if (rightlog.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish ==
            rightlog.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage) {
          std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                    ((vector<int,std::allocator<int>> *)&rightlog,
                     (iterator)
                     rightlog.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish,&right_cnt);
        }
        else {
          *rightlog.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_finish = right_cnt;
          rightlog.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish = rightlog.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish + 1;
        }
        iVar15 = test_n;
        right_cnt = 0;
        if (iVar5 == 0 && argc == 0xb) {
          if (test_n < 1) {
            uVar17 = 0;
          }
          else {
            lVar19 = 0;
            uVar17 = 0;
            do {
              uVar13 = (ulong)num_c;
              if (0 < (long)uVar13) {
                pdVar3 = test_y.
                         super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[lVar19].
                         super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start;
                uVar11 = 0;
                do {
                  if (0.0 < pdVar3[uVar11]) {
                    unaff_R13 = uVar11;
                  }
                  unaff_R13 = unaff_R13 & 0xffffffff;
                  pdVar3[uVar11] = 0.0;
                  uVar11 = uVar11 + 1;
                } while (uVar13 != uVar11);
              }
              predict(test_x.
                      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + lVar19,
                      test_y.
                      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + lVar19);
              uVar13 = (ulong)num_c;
              iVar5 = 0;
              if (1 < (long)uVar13) {
                pdVar3 = test_y.
                         super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[lVar19].
                         super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start;
                uVar12 = 1;
                uVar11 = 0;
                do {
                  dVar20 = pdVar3[uVar12];
                  pdVar1 = pdVar3 + (int)uVar11;
                  uVar16 = uVar12 & 0xffffffff;
                  if (dVar20 < *pdVar1 || dVar20 == *pdVar1) {
                    uVar16 = uVar11;
                  }
                  uVar12 = uVar12 + 1;
                  iVar5 = (int)uVar16;
                  uVar11 = uVar16;
                } while (uVar13 != uVar12);
              }
              if (0 < num_c) {
                uVar11 = 0;
                do {
                  dVar20 = 1.0;
                  if ((unaff_R13 & 0xffffffff) != uVar11) {
                    dVar20 = 0.0;
                  }
                  test_y.
                  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[lVar19].
                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar11] = dVar20;
                  uVar11 = uVar11 + 1;
                } while (uVar13 != uVar11);
              }
              uVar17 = uVar17 + ((int)unaff_R13 != iVar5);
              lVar19 = lVar19 + 1;
            } while (lVar19 < test_n);
          }
          uVar10 = iVar15 - uVar17;
          printf("Accuracy = %8.3f Correct = %5d , Wrong = %5d\n",
                 ((double)(int)uVar10 * 100.0) / (double)iVar15,(ulong)uVar10,(ulong)uVar17);
        }
        uVar17 = (int)uVar8 + 1;
        uVar8 = (ulong)uVar17;
      } while ((int)uVar17 < max_iter);
    }
    pFVar7 = fopen("rightlog","w");
    if (0 < max_iter) {
      uVar8 = 0;
      do {
        piVar2 = rightlog.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start + uVar8;
        uVar8 = uVar8 + 1;
        fprintf(pFVar7,"epoch %d accuracy %f\n",(double)*piVar2 / (double)data_n,uVar8 & 0xffffffff)
        ;
      } while ((long)uVar8 < (long)max_iter);
    }
    fclose(pFVar7);
    save();
  }
  else {
    iVar5 = strcmp(__s1,"test");
    if (iVar5 == 0) {
      init((EVP_PKEY_CTX *)0x1);
      iVar5 = data_n;
      pFVar7 = fopen("result.txt","a");
      if (data_n < 1) {
        uVar17 = 0;
      }
      else {
        lVar19 = 0;
        uVar17 = 0;
        do {
          uVar8 = (ulong)num_c;
          if (0 < (long)uVar8) {
            pdVar3 = data_y.
                     super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[lVar19].
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
            uVar13 = 0;
            do {
              if (0.0 < pdVar3[uVar13]) {
                unaff_R13 = uVar13;
              }
              unaff_R13 = unaff_R13 & 0xffffffff;
              pdVar3[uVar13] = 0.0;
              uVar13 = uVar13 + 1;
            } while (uVar8 != uVar13);
          }
          predict(data_x.
                  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + lVar19,
                  data_y.
                  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + lVar19);
          iVar15 = 0;
          if (1 < (long)num_c) {
            pdVar3 = data_y.
                     super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[lVar19].
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
            iVar15 = 0;
            lVar14 = 1;
            do {
              dVar20 = pdVar3[lVar14];
              pdVar1 = pdVar3 + iVar15;
              iVar4 = (int)lVar14;
              if (dVar20 < *pdVar1 || dVar20 == *pdVar1) {
                iVar4 = iVar15;
              }
              iVar15 = iVar4;
              lVar14 = lVar14 + 1;
            } while (num_c != lVar14);
          }
          if ((int)unaff_R13 != iVar15) {
            uVar17 = uVar17 + 1;
            fprintf(pFVar7,"%d case true label %d predict label %d\n",(ulong)((int)lVar19 + 1),
                    unaff_R13 & 0xffffffff);
            if (0 < num_c) {
              uVar8 = 0;
              do {
                fprintf(pFVar7,"%9.6f",
                        data_y.
                        super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[lVar19].
                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start[uVar8]);
                iVar15 = 0x2c;
                if (uVar8 == num_c - 1) {
                  iVar15 = 10;
                }
                fputc(iVar15,pFVar7);
                uVar8 = uVar8 + 1;
              } while ((long)uVar8 < (long)num_c);
            }
          }
          lVar19 = lVar19 + 1;
        } while (lVar19 < data_n);
      }
      uVar10 = iVar5 - uVar17;
      fprintf(pFVar7,"Accuracy = %8.3f Correct = %5d , Wrong = %5d\n",
              ((double)(int)uVar10 * 100.0) / (double)iVar5,(ulong)uVar10,(ulong)uVar17);
      fclose(pFVar7);
    }
    else {
      puts("wrong operation !");
    }
  }
  cVar9 = clock();
  printf("Total Running Time = %.3f sec\n",((double)cVar9 - (double)cVar6) / 1000000.0);
  return 0;
}

Assistant:

int main(int argc, char *argv[]) {

    /**
     * arguments:
     * 1.train ts_len data_file data_n alpha regular max_iter learn_rate [test_data_file test_n]
     * 2.test ts_len data_file data_n alpha
     */
    char *operation = argv[1];
    ts_len = atoi(argv[2]);

    char *data_file = argv[3];
    data_n = atoi(argv[4]);

    alpha = atof(argv[5]);

    readfile(data_file);

    double start_time = clock();

    if (strcmp(operation, "train") == 0) {

        regularization = atof(argv[6]);
        max_iter = atoi(argv[7]);
        learn_rate = atof(argv[8]);

        if (argc == 11) {
            test_n = atoi(argv[10]);
            readtestfile(argv[9]);
        }

        init(0);

        // training
        bool first = true;
        for (int epoch = 0; epoch < max_iter; ++epoch) {
            if (epoch % 100 == 0)
                printf("epoch %d\n", epoch);
            for (int i = 0; i < data_n; ++i) {
                if (first) {
                    printf("data format:\n");
                    printf("data:\n");
                    for (int j = 0; j < ts_len; ++j) {
                        printf("%9.6f", data_x[i][j]);
                    }
                    printf("\n");
                    printf("label:\n");
                    for (int j = 0; j < num_c; ++j) {
                        printf("%9.0f", data_y[i][j]);
                    }
                    printf("\n");
                    first = false;
                }
                train(data_x[i], data_y[i], regularization);
            }

            if (PRINT_LOG) {
                rightlog.push_back(right_cnt);
//                printf("epoch %d accuracy %f\n", epoch, 1.0 * right_cnt / data_n);
                right_cnt = 0;

                if (argc == 11 && epoch % 100 == 0) {
                    int total_case = test_n;
                    int total_wrong = 0;

                    //testing
                    for (int i = 0; i < test_n; ++i) {

                        int true_y, pred_y = 0;
                        for (int j = 0; j < num_c; j++) {
                            if (test_y[i][j] > 0) {
                                true_y = j;
                            }
                            test_y[i][j] = 0; // clear y
                        }

                        predict(test_x[i], test_y[i]);

                        // find the max(y) and its index is the label of the case
                        for (int j = 1; j < num_c; j++) {
                            if (test_y[i][j] > test_y[i][pred_y]) {
                                pred_y = j;
                            }
                        }

                        if (true_y != pred_y) {
                            ++total_wrong;
                        }

                        // reset y
                        for (int j = 0; j < num_c; j++) {
                            test_y[i][j] = 0.0;
                            if (j == true_y) {
                                test_y[i][j] = 1.0;
                            }
                        }

                    }

                    printf("Accuracy = %8.3f Correct = %5d , Wrong = %5d\n",
                           100.0 * (total_case - total_wrong) / total_case, total_case - total_wrong, total_wrong);
                }

            }

        }

        if (PRINT_LOG) {
            FILE *flog;
            flog = fopen("rightlog", "w");
            for (int i = 0; i < max_iter; ++i) {
                fprintf(flog, "epoch %d accuracy %f\n", i + 1, 1.0 * rightlog[i] / data_n);
            }
            fclose(flog);
        }

        // output w, w0 and shapelet
        save();

    } else if (strcmp(operation, "test") == 0) {

        // input w, w0 and shapelet
        init(1);

        int total_case = data_n;
        int total_wrong = 0;
        FILE *f = fopen("result.txt", "a");

        //testing
        for (int i = 0; i < data_n; ++i) {

            int true_y, pred_y = 0;
            for (int j = 0; j < num_c; j++) {
                if (data_y[i][j] > 0) {
                    true_y = j;
                }
                data_y[i][j] = 0; // clear y
            }

            predict(data_x[i], data_y[i]);
            // find the max(y) and its index is the label of the case
            for (int j = 1; j < num_c; j++) {
                if (data_y[i][j] > data_y[i][pred_y]) {
                    pred_y = j;
                }
            }

            // a wrong case found
            if (true_y != pred_y) {
                ++total_wrong;
                fprintf(f, "%d case true label %d predict label %d\n", i + 1, true_y, pred_y);
                for (int j = 0; j < num_c; ++j) {
                    fprintf(f, "%9.6f", data_y[i][j]);
                    if (j != num_c - 1) {
                        fprintf(f, ",");
                    } else {
                        fprintf(f, "\n");
                    }
                }
            }

        }

        fprintf(f, "Accuracy = %8.3f Correct = %5d , Wrong = %5d\n", 100.0 * (total_case - total_wrong) / total_case,
                total_case - total_wrong, total_wrong);
        fclose(f);

    } else {
        printf("wrong operation !\n");
    }

    double end_time = clock();
    printf("Total Running Time = %.3f sec\n", (end_time - start_time) / CLOCKS_PER_SEC);

    return 0;
}